

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  Nullable<const_char_*> pcVar1;
  uint32_t value_00;
  int size;
  unsigned_long t;
  char *failure_msg;
  LogMessage *pLVar2;
  void *data;
  LogMessage local_50;
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  CodedOutputStream *output_local;
  string *value_local;
  int field_number_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  t = std::__cxx11::string::size();
  local_30 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(0x7fffffff);
  local_28 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,"value.size() <= kInt32MaxSize");
  pcVar1 = absl_log_internal_check_op_result;
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1dd,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  value_00 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)pcVar1,value_00);
  pcVar1 = absl_log_internal_check_op_result;
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased((CodedOutputStream *)pcVar1,data,size);
  return;
}

Assistant:

void WireFormatLite::WriteBytesMaybeAliased(int field_number,
                                            const std::string& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}